

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_file_system.cpp
# Opt level: O1

void duckdb::GlobFilesInternal
               (FileSystem *fs,string *path,string *glob,bool match_directory,
               vector<duckdb::OpenFileInfo,_true> *result,bool join_path)

{
  undefined1 local_5a;
  undefined1 local_59;
  long *local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58 = (long *)0x0;
  uStack_50 = 0;
  local_5a = join_path;
  local_59 = match_directory;
  local_58 = (long *)operator_new(0x30);
  *local_58 = (long)&local_59;
  local_58[1] = (long)glob;
  local_58[2] = (long)&local_5a;
  local_58[3] = (long)result;
  local_58[4] = (long)fs;
  local_58[5] = (long)path;
  pcStack_40 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/common/local_file_system.cpp:1272:21)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/common/local_file_system.cpp:1272:21)>
             ::_M_manager;
  (*fs->_vptr_FileSystem[0x10])(fs,path,&local_58,0);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,3);
  }
  return;
}

Assistant:

static void GlobFilesInternal(FileSystem &fs, const string &path, const string &glob, bool match_directory,
                              vector<OpenFileInfo> &result, bool join_path) {
	fs.ListFiles(path, [&](const string &fname, bool is_directory) {
		if (is_directory != match_directory) {
			return;
		}
		if (Glob(fname.c_str(), fname.size(), glob.c_str(), glob.size())) {
			if (join_path) {
				result.push_back(fs.JoinPath(path, fname));
			} else {
				result.push_back(fname);
			}
		}
	});
}